

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::HoistConstantLoadAndPropagateValueBackward
          (GlobOpt *this,Var varConst,Instr *origInstr,Value *value)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ValueType type;
  ValueNumber valueNumber;
  undefined4 *puVar4;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *instr;
  Instr *this_00;
  Opnd *pOVar5;
  RegOpnd *dst;
  StackSym *this_01;
  GlobOptBlockData *pGVar6;
  BasicBlock *pBVar7;
  Value *pVVar8;
  Value *valueCopy;
  BasicBlock *block;
  undefined1 local_b8 [8];
  InvariantBlockBackwardIterator it;
  offset_in_GlobOptBlockData_to_unknown bv;
  bool typeSpecedToInt;
  Instr *loadInstr;
  RegOpnd *constRegOpnd;
  StackSym *dstSym;
  Value *value_local;
  Instr *origInstr_local;
  Var varConst_local;
  GlobOpt *this_local;
  
  bVar2 = IsLoopPrePass(this);
  this_local = (GlobOpt *)value;
  if ((!bVar2) &&
     ((this->currentBlock != this->func->m_fg->blockList ||
      (bVar2 = IR::Instr::TransfersSrcValue(origInstr), !bVar2)))) {
    bVar2 = Js::TaggedInt::Is(varConst);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x11b7,"(Js::TaggedInt::Is(varConst))","Js::TaggedInt::Is(varConst)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    sym = StackSym::New(this->func);
    dstOpnd = IR::RegOpnd::New(sym,TyVar,this->func);
    type = ValueType::GetInt(true);
    instr = IR::Instr::NewConstantLoad(dstOpnd,(intptr_t)varConst,type,this->func,(Var)0x0);
    this_00 = BasicBlock::GetFirstInstr(this->func->m_fg->blockList);
    IR::Instr::InsertAfter(this_00,instr);
    bVar2 = false;
    bVar3 = Js::TaggedInt::Is(varConst);
    if ((!bVar3) || (bVar3 = IsTypeSpecPhaseOff(this->func), bVar3)) {
      pGVar6 = CurrentBlockData(this);
      BVSparse<Memory::JitArenaAllocator>::Set(pGVar6->liveVarSyms,(sym->super_Sym).m_id);
    }
    else {
      bVar2 = true;
      instr->m_opcode = Ld_I4;
      pOVar5 = IR::Instr::GetDst(instr);
      dst = IR::Opnd::AsRegOpnd(pOVar5);
      ToInt32Dst(this,instr,dst,this->currentBlock);
      pOVar5 = IR::Instr::GetDst(instr);
      this_01 = IR::Opnd::GetStackSym(pOVar5);
      StackSym::SetIsConst(this_01);
    }
    pGVar6 = CurrentBlockData(this);
    this_local = (GlobOpt *)GlobOptBlockData::InsertNewValue(pGVar6,value,&dstOpnd->super_Opnd);
    it.inclusiveEndBlock = (BasicBlock *)0x30;
    if (bVar2) {
      it.inclusiveEndBlock = (BasicBlock *)0x38;
    }
    if (this->currentBlock != this->func->m_fg->blockList) {
      InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
                ((InvariantBlockBackwardIterator *)local_b8,this,this->currentBlock,
                 this->func->m_fg->blockList,(StackSym *)0x0,0,false);
      while (bVar2 = InvariantBlockBackwardIterator::IsValid
                               ((InvariantBlockBackwardIterator *)local_b8), bVar2) {
        pBVar7 = InvariantBlockBackwardIterator::Block((InvariantBlockBackwardIterator *)local_b8);
        BVSparse<Memory::JitArenaAllocator>::Set
                  (*(BVSparse<Memory::JitArenaAllocator> **)
                    ((long)&(it.inclusiveEndBlock)->next +
                    (long)&(pBVar7->globOptData).symToValueMap),(sym->super_Sym).m_id);
        pVVar8 = GlobOptBlockData::FindValue(&pBVar7->globOptData,&sym->super_Sym);
        if (pVVar8 == (Value *)0x0) {
          valueNumber = ::Value::GetValueNumber((Value *)this_local);
          pVVar8 = CopyValue(this,(Value *)this_local,valueNumber);
          GlobOptBlockData::SetValue(&pBVar7->globOptData,pVVar8,&sym->super_Sym);
        }
        InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)local_b8);
      }
      InvariantBlockBackwardIterator::~InvariantBlockBackwardIterator
                ((InvariantBlockBackwardIterator *)local_b8);
    }
  }
  return (Value *)this_local;
}

Assistant:

Value *
GlobOpt::HoistConstantLoadAndPropagateValueBackward(Js::Var varConst, IR::Instr * origInstr, Value * value)
{
    if (this->IsLoopPrePass() ||
        ((this->currentBlock == this->func->m_fg->blockList) &&
        origInstr->TransfersSrcValue()))
    {
        return value;
    }

    // Only hoisting taggable int const loads for now. Could be extended to other constants (floats, strings, addr opnds) if we see some benefit.
    Assert(Js::TaggedInt::Is(varConst));

    // Insert a load of the constant at the top of the function
    StackSym *    dstSym = StackSym::New(this->func);
    IR::RegOpnd * constRegOpnd = IR::RegOpnd::New(dstSym, TyVar, this->func);
    IR::Instr *   loadInstr = IR::Instr::NewConstantLoad(constRegOpnd, (intptr_t)varConst, ValueType::GetInt(true), this->func);
    this->func->m_fg->blockList->GetFirstInstr()->InsertAfter(loadInstr);

    // Type-spec the load (Support for floats needs to be added when we start hoisting float constants).
    bool typeSpecedToInt = false;
    if (Js::TaggedInt::Is(varConst) && !IsTypeSpecPhaseOff(this->func))
    {
        typeSpecedToInt = true;
        loadInstr->m_opcode = Js::OpCode::Ld_I4;
        ToInt32Dst(loadInstr, loadInstr->GetDst()->AsRegOpnd(), this->currentBlock);
        loadInstr->GetDst()->GetStackSym()->SetIsConst();
    }
    else
    {
        CurrentBlockData()->liveVarSyms->Set(dstSym->m_id);
    }

    // Add the value (object) to the current block's symToValueMap and propagate the value backward to all relevant blocks so it is available on merges.
    value = CurrentBlockData()->InsertNewValue(value, constRegOpnd);

    BVSparse<JitArenaAllocator>* GlobOptBlockData::*bv;
    bv = typeSpecedToInt ? &GlobOptBlockData::liveInt32Syms : &GlobOptBlockData::liveVarSyms; // Will need to be expanded when we start hoisting float constants.
    if (this->currentBlock != this->func->m_fg->blockList)
    {
        for (InvariantBlockBackwardIterator it(this, this->currentBlock, this->func->m_fg->blockList, nullptr);
             it.IsValid();
             it.MoveNext())
        {
            BasicBlock * block = it.Block();
            (block->globOptData.*bv)->Set(dstSym->m_id);
            if (!block->globOptData.FindValue(dstSym))
            {
                Value *const valueCopy = CopyValue(value, value->GetValueNumber());
                block->globOptData.SetValue(valueCopy, dstSym);
            }
        }
    }

    return value;
}